

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

Grammar * xercesc_4_0::Grammar::loadGrammar(XSerializeEngine *serEng)

{
  SchemaGrammar *local_30;
  SchemaGrammar *schemaGrammar;
  DTDGrammar *dtdGrammar;
  XSerializeEngine *pXStack_18;
  int type;
  XSerializeEngine *serEng_local;
  
  pXStack_18 = serEng;
  XSerializeEngine::operator>>(serEng,(int *)((long)&dtdGrammar + 4));
  if (dtdGrammar._4_4_ == 0) {
    xercesc_4_0::operator>>(pXStack_18,(DTDGrammar **)&schemaGrammar);
    serEng_local = (XSerializeEngine *)schemaGrammar;
  }
  else if (dtdGrammar._4_4_ == 1) {
    xercesc_4_0::operator>>(pXStack_18,&local_30);
    serEng_local = (XSerializeEngine *)local_30;
  }
  else if (dtdGrammar._4_4_ == 2) {
    serEng_local = (XSerializeEngine *)0x0;
  }
  else {
    serEng_local = (XSerializeEngine *)0x0;
  }
  return (Grammar *)serEng_local;
}

Assistant:

Grammar* Grammar::loadGrammar(XSerializeEngine& serEng)
{

    int type;
    serEng>>type;

    switch((GrammarType)type)
    {
    case DTDGrammarType: 
        DTDGrammar* dtdGrammar;
        serEng>>dtdGrammar;
        return dtdGrammar;
    case SchemaGrammarType:
        SchemaGrammar* schemaGrammar;
        serEng>>schemaGrammar;
        return schemaGrammar;        
    case UnKnown:
        return 0;        
    default: //we treat this same as UnKnown
        return 0;        
    }

}